

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

void sha256_final(ptls_hash_context_t *_ctx,void *md,ptls_hash_final_mode_t mode)

{
  long lVar1;
  ptls_hash_context_t *ppVar2;
  SHA256_CTX *pSVar3;
  SHA256_CTX copy;
  SHA256_CTX SStack_88;
  
  if (mode == PTLS_HASH_FINAL_MODE_SNAPSHOT) {
    ppVar2 = _ctx + 1;
    pSVar3 = &SStack_88;
    for (lVar1 = 0x1c; lVar1 != 0; lVar1 = lVar1 + -1) {
      pSVar3->h[0] = *(undefined4 *)&ppVar2->update;
      ppVar2 = (ptls_hash_context_t *)((long)&ppVar2->update + 4);
      pSVar3 = (SHA256_CTX *)((long)pSVar3 + 4);
    }
    SHA256_Final((uchar *)md,&SStack_88);
    (*ptls_clear_memory)(&SStack_88,0x70);
    return;
  }
  if (md != (void *)0x0) {
    SHA256_Final((uchar *)md,(SHA256_CTX *)(_ctx + 1));
  }
  if (mode != PTLS_HASH_FINAL_MODE_RESET) {
    if (mode == PTLS_HASH_FINAL_MODE_FREE) {
      (*ptls_clear_memory)(_ctx + 1,0x70);
      free(_ctx);
      return;
    }
    __assert_fail("!\"FIXME\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/openssl.c"
                  ,0x1fe,"void sha256_final(ptls_hash_context_t *, void *, ptls_hash_final_mode_t)")
    ;
  }
  SHA256_Init((SHA256_CTX *)(_ctx + 1));
  return;
}

Assistant:

static void sha256_final(ptls_hash_context_t *_ctx, void *md, ptls_hash_final_mode_t mode)
{
    struct sha256_context_t *ctx = (struct sha256_context_t *)_ctx;

    if (mode == PTLS_HASH_FINAL_MODE_SNAPSHOT) {
        SHA256_CTX copy = ctx->ctx;
        SHA256_Final(md, &copy);
        ptls_clear_memory(&copy, sizeof(copy));
        return;
    }

    if (md != NULL)
        SHA256_Final(md, &ctx->ctx);

    switch (mode) {
    case PTLS_HASH_FINAL_MODE_FREE:
        ptls_clear_memory(&ctx->ctx, sizeof(ctx->ctx));
        free(ctx);
        break;
    case PTLS_HASH_FINAL_MODE_RESET:
        SHA256_Init(&ctx->ctx);
        break;
    default:
        assert(!"FIXME");
        break;
    }
}